

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageColorReplace(Image *image,Color color,Color replace)

{
  int iVar1;
  uint uVar2;
  Image image_00;
  Color *pCVar3;
  undefined8 unaff_RBX;
  uchar *puVar4;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  long lVar5;
  ulong uVar6;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    image_00._8_8_ = unaff_R12;
    image_00.data = (void *)unaff_RBX;
    image_00._16_8_ = unaff_R13;
    pCVar3 = LoadImageColors(image_00);
    iVar1 = image->height;
    if (0 < (long)iVar1) {
      uVar2 = image->width;
      puVar4 = &pCVar3->a;
      lVar5 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar6 = 0;
          do {
            if (((puVar4[uVar6 * 4 + -3] == color.r) && (puVar4[uVar6 * 4 + -2] == color.g)) &&
               ((puVar4[uVar6 * 4 + -1] == color.b &&
                ((uint)color >> 0x18 == (uint)puVar4[uVar6 * 4])))) {
              puVar4[uVar6 * 4 + -3] = replace.r;
              puVar4[uVar6 * 4 + -2] = replace.g;
              puVar4[uVar6 * 4 + -1] = replace.b;
              puVar4[uVar6 * 4] = replace.a;
            }
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        lVar5 = lVar5 + 1;
        puVar4 = puVar4 + (ulong)uVar2 * 4;
      } while (lVar5 != iVar1);
    }
    iVar1 = image->format;
    free(image->data);
    image->data = pCVar3;
    image->format = 7;
    ImageFormat(image,iVar1);
    return;
  }
  return;
}

Assistant:

void ImageColorReplace(Image *image, Color color, Color replace)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            if ((pixels[y*image->width + x].r == color.r) &&
                (pixels[y*image->width + x].g == color.g) &&
                (pixels[y*image->width + x].b == color.b) &&
                (pixels[y*image->width + x].a == color.a))
            {
                pixels[y*image->width + x].r = replace.r;
                pixels[y*image->width + x].g = replace.g;
                pixels[y*image->width + x].b = replace.b;
                pixels[y*image->width + x].a = replace.a;
            }
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}